

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::ProjectionLight::Phi(ProjectionLight *this,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  ProjectionLight *pPVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  RGB *pRVar6;
  ulong uVar7;
  long lVar8;
  Point2i p;
  int c;
  int c_00;
  Float FVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar18 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar22 [60];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  Point3<float> PVar23;
  Vector3<float> VVar24;
  SampledSpectrum SVar25;
  undefined1 local_f0 [8];
  undefined1 local_e8 [8];
  Vector3<float> local_e0;
  ProjectionLight *local_d0;
  long local_c8;
  Transform *local_c0;
  Bounds2<float> *local_b8;
  SampledWavelengths *local_b0;
  ulong local_a8;
  ulong local_a0;
  WrapMode2D local_98;
  SampledSpectrum sum;
  RGBSpectrum local_80;
  undefined1 local_58 [16];
  SampledSpectrum L;
  undefined1 extraout_var [56];
  undefined1 auVar16 [56];
  undefined1 auVar17 [56];
  
  local_b0 = lambda;
  SampledSpectrum::SampledSpectrum(&sum,0.0);
  local_b8 = &this->screenBounds;
  local_c0 = &this->LightFromScreen;
  TVar5 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  lVar8 = 0;
  local_d0 = this;
  while (pPVar4 = local_d0, auVar16 = in_ZMM1._8_56_, lVar8 < (long)TVar5 >> 0x20) {
    local_a8 = lVar8 << 0x20;
    local_58 = ZEXT416((uint)((float)(int)lVar8 + 0.5));
    uVar7 = 0;
    local_c8 = lVar8;
    while ((long)uVar7 < (long)TVar5.x) {
      auVar18._8_8_ = 0;
      auVar18._0_4_ = TVar5.x;
      auVar18._4_4_ = TVar5.y;
      auVar18 = vcvtdq2ps_avx(auVar18);
      auVar22 = ZEXT1260(auVar18._4_12_);
      auVar3 = vinsertps_avx(ZEXT416((uint)((float)(int)uVar7 + 0.5)),ZEXT416((uint)local_58._0_4_),
                             0x10);
      auVar18 = vdivps_avx(auVar3,auVar18);
      uVar1 = vmovlps_avx(auVar18);
      local_80.rgb._0_8_ = uVar1;
      auVar10._0_8_ = Bounds2<float>::Lerp(local_b8,(Point2f *)&local_80);
      auVar10._8_56_ = extraout_var;
      uVar2 = vmovlps_avx(auVar10._0_16_);
      local_80.rgb.b = 0.0;
      local_80.rgb.r = (Float)(int)uVar2;
      local_80.rgb.g = (Float)(int)(uVar2 >> 0x20);
      auVar16 = extraout_var;
      PVar23 = Transform::operator()(local_c0,(Point3<float> *)&local_80);
      local_e0.super_Tuple3<pbrt::Vector3,_float>.z = PVar23.super_Tuple3<pbrt::Point3,_float>.z;
      auVar11._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar11._8_56_ = auVar16;
      local_e0.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar11._0_16_);
      VVar24 = Normalize<float>((Vector3<float> *)(local_e8 + 8));
      auVar19._0_4_ = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar19._4_60_ = auVar22;
      auVar12._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar12._8_56_ = auVar16;
      local_f0._0_4_ = 0.0;
      local_f0._4_4_ = 0.0;
      local_e8._0_4_ = 0.0;
      local_e0.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar12._0_16_);
      p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_a8 | uVar7);
      auVar15 = auVar19;
      local_e0.super_Tuple3<pbrt::Vector3,_float>.z = auVar19._0_4_;
      local_a0 = uVar7;
      for (c_00 = 0; pPVar4 = local_d0, auVar16 = auVar15._8_56_, c_00 != 3; c_00 = c_00 + 1) {
        WrapMode2D::WrapMode2D(&local_98,Clamp);
        FVar9 = Image::GetChannel(&this->image,p,c_00,local_98);
        pRVar6 = (RGB *)local_f0;
        if ((c_00 != 0) && (pRVar6 = (RGB *)(local_f0 + 4), c_00 != 1)) {
          pRVar6 = (RGB *)local_e8;
        }
        pRVar6->r = FVar9;
      }
      auVar17 = (undefined1  [56])0x0;
      RGBSpectrum::RGBSpectrum(&local_80,local_d0->imageColorSpace,(RGB *)local_f0);
      SVar25 = RGBSpectrum::Sample(&local_80,local_b0);
      auVar20._0_8_ = SVar25.values.values._8_8_;
      auVar20._8_56_ = auVar16;
      auVar13._0_8_ = SVar25.values.values._0_8_;
      auVar13._8_56_ = auVar17;
      L.values.values = (array<float,_4>)vmovlhps_avx(auVar13._0_16_,auVar20._0_16_);
      auVar17 = (undefined1  [56])0x0;
      SVar25 = SampledSpectrum::operator*(&L,auVar19._0_4_ * auVar19._0_4_ * auVar19._0_4_);
      in_ZMM1._0_8_ = SVar25.values.values._8_8_;
      in_ZMM1._8_56_ = auVar16;
      auVar14._0_8_ = SVar25.values.values._0_8_;
      auVar14._8_56_ = auVar17;
      local_80._0_16_ = vmovlhps_avx(auVar14._0_16_,in_ZMM1._0_16_);
      SampledSpectrum::operator+=(&sum,(SampledSpectrum *)&local_80);
      TVar5 = (pPVar4->image).resolution.super_Tuple2<pbrt::Point2,_int>;
      uVar7 = local_a0 + 1;
    }
    lVar8 = local_c8 + 1;
  }
  auVar17 = (undefined1  [56])0x0;
  SVar25 = SampledSpectrum::operator*(&sum,local_d0->scale * local_d0->A);
  auVar21._0_8_ = SVar25.values.values._8_8_;
  auVar21._8_56_ = auVar16;
  auVar15._0_8_ = SVar25.values.values._0_8_;
  auVar15._8_56_ = auVar17;
  local_80._0_16_ = vmovlhps_avx(auVar15._0_16_,auVar21._0_16_);
  TVar5 = (pPVar4->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  SVar25 = SampledSpectrum::operator/((SampledSpectrum *)&local_80,(float)(TVar5.y * TVar5.x));
  return (array<float,_4>)(array<float,_4>)SVar25;
}

Assistant:

SampledSpectrum ProjectionLight::Phi(const SampledWavelengths &lambda) const {
    SampledSpectrum sum(0.f);
    for (int v = 0; v < image.Resolution().y; ++v)
        for (int u = 0; u < image.Resolution().x; ++u) {
            Point2f ps = screenBounds.Lerp(
                {(u + .5f) / image.Resolution().x, (v + .5f) / image.Resolution().y});
            Vector3f w = Vector3f(LightFromScreen(Point3f(ps.x, ps.y, 0)));
            w = Normalize(w);
            Float dwdA = Pow<3>(w.z);

            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({u, v}, c);

            SampledSpectrum L = RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);

            sum += L * dwdA;
        }

    return scale * A * sum / (image.Resolution().x * image.Resolution().y);
}